

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_ssh_setkey(ssh_cipher *cipher,void *key)

{
  blowfish_ctx *ctx;
  void *key_local;
  ssh_cipher *cipher_local;
  
  blowfish_setkey((BlowfishContext *)(cipher + -0x20a),(uchar *)key,
                  (short)cipher->vt->padded_keybytes);
  return;
}

Assistant:

static void blowfish_ssh_setkey(ssh_cipher *cipher, const void *key)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_setkey(&ctx->context, key, ctx->ciph.vt->padded_keybytes);
}